

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t driver::zetMetricGroupCloseExp(zet_metric_group_handle_t hMetricGroup)

{
  ze_result_t zVar1;
  
  if (DAT_0010e878 != (code *)0x0) {
    zVar1 = (*DAT_0010e878)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCloseExp(
        zet_metric_group_handle_t hMetricGroup          ///< [in] Handle of the metric group
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCloseExp = context.zetDdiTable.MetricGroupExp.pfnCloseExp;
        if( nullptr != pfnCloseExp )
        {
            result = pfnCloseExp( hMetricGroup );
        }
        else
        {
            // generic implementation
        }

        return result;
    }